

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int carith_ptr(lua_State *L,CTState *cts,CDArith *ca,MMS mm)

{
  uint8_t *puVar1;
  int iVar2;
  CTSize CVar3;
  intptr_t diff;
  uint8_t *pp2;
  GCcdata *cd;
  CTypeID id;
  CTSize sz;
  ptrdiff_t idx;
  uint8_t *pp;
  CType *ctp;
  CDArith *pCStack_100;
  MMS mm_local;
  CDArith *ca_local;
  CTState *cts_local;
  lua_State *L_local;
  CTState *local_e0;
  undefined4 local_d4;
  CTState *local_d0;
  void *local_c8;
  GCcdata *cd_1;
  CDArith *local_b8;
  void *local_b0;
  MRef *local_a8;
  CTState *local_a0;
  CTypeID local_94;
  CDArith *local_90;
  undefined4 local_84;
  CTState *local_80;
  undefined4 local_74;
  CTState *local_70;
  undefined4 local_64;
  void *local_60;
  MRef *local_58;
  CTState *local_50;
  undefined4 local_44;
  void *local_40;
  MRef *local_38;
  char *local_30;
  MRef *local_28;
  CTState *local_20;
  
  pp = (uint8_t *)ca->ct[0];
  idx = (ptrdiff_t)ca->p[0];
  ctp._4_4_ = mm;
  pCStack_100 = ca;
  ca_local = (CDArith *)cts;
  cts_local = (CTState *)L;
  if ((((CType *)pp)->info >> 0x1c == 2) || ((((CType *)pp)->info & 0xfc000000) == 0x30000000)) {
    if (((mm == MM_sub) || (((mm == MM_eq || (mm == MM_lt)) || (mm == MM_le)))) &&
       ((ca->ct[1]->info >> 0x1c == 2 || ((ca->ct[1]->info & 0xfc000000) == 0x30000000)))) {
      puVar1 = ca->p[1];
      if (mm == MM_eq) {
        L->top[-1].u64 = (long)(int)(((uint8_t *)idx == puVar1) + 1) << 0x2f ^ 0xffffffffffffffff;
        return 1;
      }
      iVar2 = lj_cconv_compatptr(cts,(CType *)pp,ca->ct[1],8);
      if (iVar2 == 0) {
        return 0;
      }
      if (ctp._4_4_ != MM_sub) {
        if (ctp._4_4_ == MM_lt) {
          cts_local->miscmap[-1].freetop.ptr64 =
               (long)(int)(((ulong)idx < puVar1) + 1) << 0x2f ^ 0xffffffffffffffff;
          return 1;
        }
        cts_local->miscmap[-1].freetop.ptr64 =
             (long)(int)(((ulong)idx <= puVar1) + 1) << 0x2f ^ 0xffffffffffffffff;
        return 1;
      }
      CVar3 = lj_ctype_size((CTState *)ca_local,*(uint *)pp & 0xffff);
      if ((CVar3 != 0) && (CVar3 != 0xffffffff)) {
        cts_local->miscmap[-1].freetop.ptr64 =
             (uint64_t)(double)(long)(int)((idx - (long)puVar1) / (long)(int)CVar3);
        return 1;
      }
      return 0;
    }
    if (((mm != MM_add) && (mm != MM_sub)) || (ca->ct[1]->info >> 0x1c != 0)) {
      return 0;
    }
    local_d4 = 0xb;
    local_84 = 0xb;
    local_d0 = cts;
    local_80 = cts;
    lj_cconv_ct_ct(cts,cts->tab + 0xb,ca->ct[1],(uint8_t *)&id,ca->p[1],0);
    if (ctp._4_4_ == MM_sub) {
      _id = -_id;
    }
  }
  else {
    if (((mm != MM_add) || (((CType *)pp)->info >> 0x1c != 0)) ||
       ((ca->ct[1]->info >> 0x1c != 2 && ((ca->ct[1]->info & 0xfc000000) != 0x30000000)))) {
      return 0;
    }
    pp = (uint8_t *)ca->ct[1];
    idx = (ptrdiff_t)ca->p[1];
    L_local._4_4_ = 0xb;
    local_74 = 0xb;
    local_e0 = cts;
    local_70 = cts;
    lj_cconv_ct_ct(cts,cts->tab + 0xb,ca->ct[0],(uint8_t *)&id,ca->p[0],0);
  }
  CVar3 = lj_ctype_size((CTState *)ca_local,*(uint *)pp & 0xffff);
  if (CVar3 == 0xffffffff) {
    L_local._0_4_ = 0;
  }
  else {
    idx = _id * (int)CVar3 + idx;
    cd_1._4_4_ = lj_ctype_intern((CTState *)ca_local,(*(uint *)pp & 0xffff | 0x30000) + 0x20000000,8
                                );
    local_b8 = ca_local;
    cd_1._0_4_ = 8;
    local_c8 = lj_mem_newgco((lua_State *)ca_local->ct[0],0x18);
    *(undefined1 *)((long)local_c8 + 9) = 10;
    local_90 = local_b8;
    local_94 = cd_1._4_4_;
    *(short *)((long)local_c8 + 10) = (short)cd_1._4_4_;
    *(ptrdiff_t *)((long)local_c8 + 0x10) = idx;
    local_a8 = &cts_local->miscmap[-1].freetop;
    local_a0 = cts_local;
    local_50 = cts_local;
    local_64 = 0xfffffff5;
    local_44 = 0xfffffff5;
    local_a8->ptr64 = (ulong)local_c8 | 0xfffa800000000000;
    local_20 = cts_local;
    local_30 = "store to dead GC object";
    if ((cts_local->L->gclist).gcptr64 <= (cts_local->L->glref).ptr64) {
      local_b0 = local_c8;
      local_60 = local_c8;
      local_58 = local_a8;
      local_40 = local_c8;
      local_38 = local_a8;
      local_28 = local_a8;
      lj_gc_step((lua_State *)cts_local);
    }
    L_local._0_4_ = 1;
  }
  return (int)L_local;
}

Assistant:

static int carith_ptr(lua_State *L, CTState *cts, CDArith *ca, MMS mm)
{
  CType *ctp = ca->ct[0];
  uint8_t *pp = ca->p[0];
  ptrdiff_t idx;
  CTSize sz;
  CTypeID id;
  GCcdata *cd;
  if (ctype_isptr(ctp->info) || ctype_isrefarray(ctp->info)) {
    if ((mm == MM_sub || mm == MM_eq || mm == MM_lt || mm == MM_le) &&
	(ctype_isptr(ca->ct[1]->info) || ctype_isrefarray(ca->ct[1]->info))) {
      uint8_t *pp2 = ca->p[1];
      if (mm == MM_eq) {  /* Pointer equality. Incompatible pointers are ok. */
	setboolV(L->top-1, (pp == pp2));
	return 1;
      }
      if (!lj_cconv_compatptr(cts, ctp, ca->ct[1], CCF_IGNQUAL))
	return 0;
      if (mm == MM_sub) {  /* Pointer difference. */
	intptr_t diff;
	sz = lj_ctype_size(cts, ctype_cid(ctp->info));  /* Element size. */
	if (sz == 0 || sz == CTSIZE_INVALID)
	  return 0;
	diff = ((intptr_t)pp - (intptr_t)pp2) / (int32_t)sz;
	/* All valid pointer differences on x64 are in (-2^47, +2^47),
	** which fits into a double without loss of precision.
	*/
	setintptrV(L->top-1, (int32_t)diff);
	return 1;
      } else if (mm == MM_lt) {  /* Pointer comparison (unsigned). */
	setboolV(L->top-1, ((uintptr_t)pp < (uintptr_t)pp2));
	return 1;
      } else {
	lj_assertL(mm == MM_le, "bad metamethod %d", mm);
	setboolV(L->top-1, ((uintptr_t)pp <= (uintptr_t)pp2));
	return 1;
      }
    }
    if (!((mm == MM_add || mm == MM_sub) && ctype_isnum(ca->ct[1]->info)))
      return 0;
    lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT_PSZ), ca->ct[1],
		   (uint8_t *)&idx, ca->p[1], 0);
    if (mm == MM_sub) idx = -idx;
  } else if (mm == MM_add && ctype_isnum(ctp->info) &&
      (ctype_isptr(ca->ct[1]->info) || ctype_isrefarray(ca->ct[1]->info))) {
    /* Swap pointer and index. */
    ctp = ca->ct[1]; pp = ca->p[1];
    lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT_PSZ), ca->ct[0],
		   (uint8_t *)&idx, ca->p[0], 0);
  } else {
    return 0;
  }
  sz = lj_ctype_size(cts, ctype_cid(ctp->info));  /* Element size. */
  if (sz == CTSIZE_INVALID)
    return 0;
  pp += idx*(int32_t)sz;  /* Compute pointer + index. */
  id = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(ctp->info)),
		       CTSIZE_PTR);
  cd = lj_cdata_new(cts, id, CTSIZE_PTR);
  *(uint8_t **)cdataptr(cd) = pp;
  setcdataV(L, L->top-1, cd);
  lj_gc_check(L);
  return 1;
}